

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
cfd::core::Deserializer::ReadVariableBuffer
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          Deserializer *this)

{
  uint uVar1;
  uint64_t size;
  uchar *puVar2;
  uchar *__dest;
  allocator_type *__a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc0;
  uint8_t *buf;
  uint64_t data_size;
  Deserializer *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result;
  
  __a = (allocator_type *)__return_storage_ptr__;
  size = ReadVariableInt(this);
  if (size == 0) {
    memset(__return_storage_ptr__,0,0x18);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3e7f5c);
  }
  else {
    CheckReadSize(this,size);
    puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3e7f7b);
    uVar1 = this->offset_;
    ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3e7fa2);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_ffffffffffffffc0,(size_type)this,__a);
    ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3e7fbe);
    __dest = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3e7fc7);
    memcpy(__dest,puVar2 + uVar1,size);
    this->offset_ = (int)size + this->offset_;
  }
  return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a;
}

Assistant:

std::vector<uint8_t> Deserializer::ReadVariableBuffer() {
  // TODO(k-matsuzawa) need endian support.
  uint64_t data_size = ReadVariableInt();
  if (data_size == 0) {
    return std::vector<uint8_t>();
  }
  CheckReadSize(data_size);

  uint8_t* buf = buffer_.data() + offset_;
  std::vector<uint8_t> result(data_size);
  memcpy(result.data(), buf, data_size);
  offset_ += static_cast<uint32_t>(data_size);
  return result;
}